

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall despot::util::tinyxml::TiXmlNode::~TiXmlNode(TiXmlNode *this)

{
  TiXmlNode *pTVar1;
  TiXmlNode *temp;
  TiXmlNode *node;
  TiXmlNode *this_local;
  
  (this->super_TiXmlBase)._vptr_TiXmlBase = (_func_int **)&PTR__TiXmlNode_0026f3f0;
  pTVar1 = this->firstChild;
  while (temp = pTVar1, temp != (TiXmlNode *)0x0) {
    pTVar1 = temp->next;
    if (temp != (TiXmlNode *)0x0) {
      (*(temp->super_TiXmlBase)._vptr_TiXmlBase[1])();
    }
  }
  TiXmlString::~TiXmlString(&this->value);
  TiXmlBase::~TiXmlBase(&this->super_TiXmlBase);
  return;
}

Assistant:

TiXmlNode::~TiXmlNode() {
	TiXmlNode* node = firstChild;
	TiXmlNode* temp = 0;

	while (node) {
		temp = node;
		node = node->next;
		delete temp;
	}
}